

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDup(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pMan;
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtkNew = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      for (iVar7 = 0; iVar1 = pNtk->vObjs->nSize, iVar7 < iVar1; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar7);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          iVar1 = Abc_AigNodeIsAnd(pAVar3);
          if (iVar1 != 0) {
            pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
            pAVar4 = Abc_ObjChild0Copy(pAVar3);
            p1 = Abc_ObjChild1Copy(pAVar3);
            pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
            (pAVar3->field_6).pCopy = pAVar4;
          }
        }
      }
      for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar7);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          iVar1 = Abc_AigNodeIsAnd(pAVar3);
          if ((iVar1 != 0) && ((pAVar3->field_5).pData != (void *)0x0)) {
            ((pAVar3->field_6).pCopy)->field_5 =
                 *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)
                  ((long)(pAVar3->field_5).pData + 0x40);
          }
        }
        iVar1 = pNtk->vObjs->nSize;
      }
      for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = Abc_NtkCo(pNtk,iVar7);
        pAVar3 = (pAVar4->field_6).pCopy;
        pAVar4 = Abc_ObjChild0Copy(pAVar4);
        Abc_ObjAddFanin(pAVar3,pAVar4);
      }
      if (pNtk->nObjCounts[7] != pNtkNew->nObjCounts[7]) {
        printf(
              "Warning: Structural hashing during duplication reduced %d nodes (this is a minor bug).\n"
              );
      }
    }
    else {
      for (iVar7 = 0; iVar1 = pNtk->vObjs->nSize, iVar7 < iVar1; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar7);
        if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).pTemp == (void *)0x0)) {
          uVar2 = 0;
          if (pNtk->ntkFunc == ABC_FUNC_BLACKBOX) {
            uVar2 = (uint)((*(uint *)&pAVar3->field_0x14 & 0xf) == 6);
          }
          Abc_NtkDupObj(pNtkNew,pAVar3,uVar2);
        }
      }
      for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar7);
        if ((((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xe) != 8)) &&
            (uVar2 = *(uint *)&pAVar3->field_0x14 & 0xf, uVar2 != 5)) && (uVar2 != 10)) {
          for (lVar8 = 0; lVar8 < (pAVar3->vFanins).nSize; lVar8 = lVar8 + 1) {
            Abc_ObjAddFanin((pAVar3->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar8]] +
                             0x40));
          }
        }
        iVar1 = pNtk->vObjs->nSize;
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar5 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar5;
    }
    if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
      pAVar5 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtkNew->pExcare = pAVar5;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtkNew,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtkNew,pNtk);
    }
    if (pNtk->pWLoadUsed != (char *)0x0) {
      pcVar6 = Abc_UtilStrsav(pNtk->pWLoadUsed);
      pNtkNew->pWLoadUsed = pcVar6;
    }
    iVar7 = Abc_NtkCheck(pNtkNew);
    if (iVar7 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtkNew;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    if ( Abc_NtkIsStrash(pNtk) )
    {
        // copy the AND gates
        Abc_AigForEachAnd( pNtk, pObj, i )
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        // relink the choice nodes
        Abc_AigForEachAnd( pNtk, pObj, i )
            if ( pObj->pData )
                pObj->pCopy->pData = ((Abc_Obj_t *)pObj->pData)->pCopy;
        // relink the CO nodes
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
        // get the number of nodes before and after
        if ( Abc_NtkNodeNum(pNtk) != Abc_NtkNodeNum(pNtkNew) )
            printf( "Warning: Structural hashing during duplication reduced %d nodes (this is a minor bug).\n",
                Abc_NtkNodeNum(pNtk) - Abc_NtkNodeNum(pNtkNew) );
    }
    else
    {
        // duplicate the nets and nodes (CIs/COs/latches already dupped)
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( pObj->pCopy == NULL )
                Abc_NtkDupObj(pNtkNew, pObj, Abc_NtkHasBlackbox(pNtk) && Abc_ObjIsNet(pObj));
        // reconnect all objects (no need to transfer attributes on edges)
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}